

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbnf.cpp
# Opt level: O3

int32_t __thiscall icu_63::LocalizationInfo::indexForRuleSet(LocalizationInfo *this,UChar *ruleset)

{
  int iVar1;
  int32_t iVar2;
  UChar *s2;
  uint uVar3;
  undefined4 extraout_var;
  
  if ((ruleset != (UChar *)0x0) && (iVar1 = (*this->_vptr_LocalizationInfo[3])(), 0 < iVar1)) {
    uVar3 = 0;
    do {
      iVar1 = (*this->_vptr_LocalizationInfo[4])(this,(ulong)uVar3);
      s2 = (UChar *)CONCAT44(extraout_var,iVar1);
      if (s2 == ruleset) {
        return uVar3;
      }
      if ((s2 != (UChar *)0x0) && (iVar2 = u_strcmp_63(ruleset,s2), iVar2 == 0)) {
        return uVar3;
      }
      uVar3 = uVar3 + 1;
      iVar1 = (*this->_vptr_LocalizationInfo[3])(this);
    } while ((int)uVar3 < iVar1);
  }
  return -1;
}

Assistant:

int32_t
LocalizationInfo::indexForRuleSet(const UChar* ruleset) const {
    if (ruleset) {
        for (int i = 0; i < getNumberOfRuleSets(); ++i) {
            if (streq(ruleset, getRuleSetName(i))) {
                return i;
            }
        }
    }
    return -1;
}